

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

wchar_t zip_read_data_none(archive_read *a,void **_buff,size_t *size,int64_t *offset)

{
  uint32_t uVar1;
  wchar_t wVar2;
  size_t local_80;
  size_t dsize;
  size_t dec_size;
  uint64_t uncompressed;
  uint64_t compressed;
  ssize_t grabbing_bytes;
  char *p;
  ulong uStack_48;
  wchar_t r;
  ssize_t bytes_avail;
  char *buff;
  zip *zip;
  int64_t *offset_local;
  size_t *size_local;
  void **_buff_local;
  archive_read *a_local;
  
  buff = (char *)a->format->data;
  zip = (zip *)offset;
  offset_local = (int64_t *)size;
  size_local = (size_t *)_buff;
  _buff_local = (void **)a;
  if ((*(ushort *)(*(long *)(buff + 0x68) + 0x7e) & 8) == 0) {
    if (*(long *)(buff + 0x70) == 0) {
      buff[0x9a] = '\x01';
      if ((buff[0x1f0] != '\0') &&
         (wVar2 = check_authentication_code(a,(void *)0x0), wVar2 != L'\0')) {
        return wVar2;
      }
      return L'\0';
    }
    bytes_avail = (ssize_t)__archive_read_ahead(a,1,(ssize_t *)&stack0xffffffffffffffb8);
    if ((long)uStack_48 < 1) {
      archive_set_error((archive *)_buff_local,0x54,"Truncated ZIP file data");
      return L'\xffffffe2';
    }
    if (*(long *)(buff + 0x70) < (long)uStack_48) {
      uStack_48 = *(ulong *)(buff + 0x70);
    }
  }
  else {
    compressed = 0x18;
    if (buff[0x1f0] != '\0') {
      compressed = 0x22;
    }
    bytes_avail = (ssize_t)__archive_read_ahead(a,compressed,(ssize_t *)&stack0xffffffffffffffb8);
    if ((long)uStack_48 < (long)compressed) {
      archive_set_error((archive *)_buff_local,0x54,"Truncated ZIP file data");
      return L'\xffffffe2';
    }
    grabbing_bytes = bytes_avail;
    if (buff[0x1f0] != '\0') {
      grabbing_bytes = bytes_avail + 10;
    }
    if (((((*(char *)grabbing_bytes == 'P') && (*(char *)(grabbing_bytes + 1) == 'K')) &&
         (*(char *)(grabbing_bytes + 2) == '\a')) && (*(char *)(grabbing_bytes + 3) == '\b')) &&
       (((uVar1 = archive_le32dec((void *)(grabbing_bytes + 4)),
         (ulong)uVar1 == *(ulong *)(buff + 0x88) || (buff[0x98] != '\0')) ||
        ((buff[0x1f0] != '\0' && (*(int *)(*(long *)(buff + 0x68) + 0x84) == 2)))))) {
      if ((*(byte *)(*(long *)(buff + 0x68) + 0x82) & 1) == 0) {
        uVar1 = archive_le32dec((void *)(grabbing_bytes + 4));
        *(uint32_t *)(*(long *)(buff + 0x68) + 0x78) = uVar1;
        uVar1 = archive_le32dec((void *)(grabbing_bytes + 8));
        *(ulong *)(*(long *)(buff + 0x68) + 0x28) = (ulong)uVar1;
        uVar1 = archive_le32dec((void *)(grabbing_bytes + 0xc));
        *(ulong *)(*(long *)(buff + 0x68) + 0x30) = (ulong)uVar1;
        buff[0x60] = '\x10';
        buff[0x61] = '\0';
        buff[0x62] = '\0';
        buff[99] = '\0';
        buff[100] = '\0';
        buff[0x65] = '\0';
        buff[0x66] = '\0';
        buff[0x67] = '\0';
      }
      else {
        uVar1 = archive_le32dec((void *)(grabbing_bytes + 4));
        *(uint32_t *)(*(long *)(buff + 0x68) + 0x78) = uVar1;
        uncompressed = archive_le64dec((void *)(grabbing_bytes + 8));
        dec_size = archive_le64dec((void *)(grabbing_bytes + 0x10));
        if ((0x7fffffffffffffff < uncompressed) || (0x7fffffffffffffff < dec_size)) {
          archive_set_error((archive *)_buff_local,0x54,"Overflow of 64-bit file sizes");
          return L'\xffffffe7';
        }
        *(uint64_t *)(*(long *)(buff + 0x68) + 0x28) = uncompressed;
        *(size_t *)(*(long *)(buff + 0x68) + 0x30) = dec_size;
        buff[0x60] = '\x18';
        buff[0x61] = '\0';
        buff[0x62] = '\0';
        buff[99] = '\0';
        buff[100] = '\0';
        buff[0x65] = '\0';
        buff[0x66] = '\0';
        buff[0x67] = '\0';
      }
      if ((buff[0x1f0] != '\0') &&
         (wVar2 = check_authentication_code((archive_read *)_buff_local,(void *)bytes_avail),
         wVar2 != L'\0')) {
        return wVar2;
      }
      buff[0x9a] = '\x01';
      return L'\0';
    }
    grabbing_bytes = grabbing_bytes + 1;
    while ((ulong)grabbing_bytes < (bytes_avail + uStack_48) - 4) {
      if (*(char *)(grabbing_bytes + 3) == 'P') {
        grabbing_bytes = grabbing_bytes + 3;
      }
      else if (*(char *)(grabbing_bytes + 3) == 'K') {
        grabbing_bytes = grabbing_bytes + 2;
      }
      else if (*(char *)(grabbing_bytes + 3) == '\a') {
        grabbing_bytes = grabbing_bytes + 1;
      }
      else {
        if ((((*(char *)(grabbing_bytes + 3) == '\b') && (*(char *)(grabbing_bytes + 2) == '\a')) &&
            (*(char *)(grabbing_bytes + 1) == 'K')) && (*(char *)grabbing_bytes == 'P')) {
          if (buff[0x1f0] != '\0') {
            grabbing_bytes = grabbing_bytes + -10;
          }
          break;
        }
        grabbing_bytes = grabbing_bytes + 4;
      }
    }
    uStack_48 = grabbing_bytes - bytes_avail;
  }
  if ((buff[0x184] != '\0') || (buff[0x1e0] != '\0')) {
    dsize = uStack_48;
    if (*(ulong *)(buff + 0x160) < uStack_48) {
      dsize = *(size_t *)(buff + 0x160);
    }
    if (buff[0x184] == '\0') {
      local_80 = dsize;
      __hmac_sha1_update((archive_hmac_sha1_ctx *)(buff + 0x1e8),(uint8_t *)bytes_avail,dsize);
      aes_ctr_update((archive_crypto_ctx *)(buff + 0x188),(uint8_t *)bytes_avail,dsize,
                     *(uint8_t **)(buff + 0x150),&local_80);
    }
    else {
      trad_enc_decrypt_update
                ((trad_enc_ctx *)(buff + 0x178),(uint8_t *)bytes_avail,dsize,
                 *(uint8_t **)(buff + 0x150),dsize);
    }
    uStack_48 = dsize;
    bytes_avail = *(ssize_t *)(buff + 0x150);
  }
  *offset_local = uStack_48;
  *(ulong *)(buff + 0x70) = *(long *)(buff + 0x70) - uStack_48;
  *(ulong *)(buff + 0x80) = uStack_48 + *(long *)(buff + 0x80);
  *(ulong *)(buff + 0x78) = uStack_48 + *(long *)(buff + 0x78);
  *(ulong *)(buff + 0x60) = uStack_48 + *(long *)(buff + 0x60);
  *size_local = bytes_avail;
  return L'\0';
}

Assistant:

static int
zip_read_data_none(struct archive_read *a, const void **_buff,
    size_t *size, int64_t *offset)
{
	struct zip *zip;
	const char *buff;
	ssize_t bytes_avail;
	int r;

	(void)offset; /* UNUSED */

	zip = (struct zip *)(a->format->data);

	if (zip->entry->zip_flags & ZIP_LENGTH_AT_END) {
		const char *p;
		ssize_t grabbing_bytes = 24;

		if (zip->hctx_valid)
			grabbing_bytes += AUTH_CODE_SIZE;
		/* Grab at least 24 bytes. */
		buff = __archive_read_ahead(a, grabbing_bytes, &bytes_avail);
		if (bytes_avail < grabbing_bytes) {
			/* Zip archives have end-of-archive markers
			   that are longer than this, so a failure to get at
			   least 24 bytes really does indicate a truncated
			   file. */
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated ZIP file data");
			return (ARCHIVE_FATAL);
		}
		/* Check for a complete PK\007\010 signature, followed
		 * by the correct 4-byte CRC. */
		p = buff;
		if (zip->hctx_valid)
			p += AUTH_CODE_SIZE;
		if (p[0] == 'P' && p[1] == 'K'
		    && p[2] == '\007' && p[3] == '\010'
		    && (archive_le32dec(p + 4) == zip->entry_crc32
			|| zip->ignore_crc32
			|| (zip->hctx_valid
			 && zip->entry->aes_extra.vendor == AES_VENDOR_AE_2))) {
			if (zip->entry->flags & LA_USED_ZIP64) {
				uint64_t compressed, uncompressed;
				zip->entry->crc32 = archive_le32dec(p + 4);
				compressed = archive_le64dec(p + 8);
				uncompressed = archive_le64dec(p + 16);
				if (compressed > INT64_MAX || uncompressed > INT64_MAX) {
					archive_set_error(&a->archive,
					    ARCHIVE_ERRNO_FILE_FORMAT,
					    "Overflow of 64-bit file sizes");
					return ARCHIVE_FAILED;
				}
				zip->entry->compressed_size = compressed;
				zip->entry->uncompressed_size = uncompressed;
				zip->unconsumed = 24;
			} else {
				zip->entry->crc32 = archive_le32dec(p + 4);
				zip->entry->compressed_size =
					archive_le32dec(p + 8);
				zip->entry->uncompressed_size =
					archive_le32dec(p + 12);
				zip->unconsumed = 16;
			}
			if (zip->hctx_valid) {
				r = check_authentication_code(a, buff);
				if (r != ARCHIVE_OK)
					return (r);
			}
			zip->end_of_entry = 1;
			return (ARCHIVE_OK);
		}
		/* If not at EOF, ensure we consume at least one byte. */
		++p;

		/* Scan forward until we see where a PK\007\010 signature
		 * might be. */
		/* Return bytes up until that point.  On the next call,
		 * the code above will verify the data descriptor. */
		while (p < buff + bytes_avail - 4) {
			if (p[3] == 'P') { p += 3; }
			else if (p[3] == 'K') { p += 2; }
			else if (p[3] == '\007') { p += 1; }
			else if (p[3] == '\010' && p[2] == '\007'
			    && p[1] == 'K' && p[0] == 'P') {
				if (zip->hctx_valid)
					p -= AUTH_CODE_SIZE;
				break;
			} else { p += 4; }
		}
		bytes_avail = p - buff;
	} else {
		if (zip->entry_bytes_remaining == 0) {
			zip->end_of_entry = 1;
			if (zip->hctx_valid) {
				r = check_authentication_code(a, NULL);
				if (r != ARCHIVE_OK)
					return (r);
			}
			return (ARCHIVE_OK);
		}
		/* Grab a bunch of bytes. */
		buff = __archive_read_ahead(a, 1, &bytes_avail);
		if (bytes_avail <= 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated ZIP file data");
			return (ARCHIVE_FATAL);
		}
		if (bytes_avail > zip->entry_bytes_remaining)
			bytes_avail = (ssize_t)zip->entry_bytes_remaining;
	}
	if (zip->tctx_valid || zip->cctx_valid) {
		size_t dec_size = bytes_avail;

		if (dec_size > zip->decrypted_buffer_size)
			dec_size = zip->decrypted_buffer_size;
		if (zip->tctx_valid) {
			trad_enc_decrypt_update(&zip->tctx,
			    (const uint8_t *)buff, dec_size,
			    zip->decrypted_buffer, dec_size);
		} else {
			size_t dsize = dec_size;
			archive_hmac_sha1_update(&zip->hctx,
			    (const uint8_t *)buff, dec_size);
			archive_decrypto_aes_ctr_update(&zip->cctx,
			    (const uint8_t *)buff, dec_size,
			    zip->decrypted_buffer, &dsize);
		}
		bytes_avail = dec_size;
		buff = (const char *)zip->decrypted_buffer;
	}
	*size = bytes_avail;
	zip->entry_bytes_remaining -= bytes_avail;
	zip->entry_uncompressed_bytes_read += bytes_avail;
	zip->entry_compressed_bytes_read += bytes_avail;
	zip->unconsumed += bytes_avail;
	*_buff = buff;
	return (ARCHIVE_OK);
}